

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

CppStringType __thiscall google::protobuf::FieldDescriptor::cpp_string_type(FieldDescriptor *this)

{
  bool bVar1;
  CppType CVar2;
  CppFeatures_StringType CVar3;
  Type TVar4;
  FeatureSet *pFVar5;
  ConstType pCVar6;
  LogMessage *pLVar7;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  LogMessageFatal local_68 [19];
  Voidify local_55 [20];
  byte local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *this_local;
  
  local_18 = this;
  CVar2 = cpp_type(this);
  local_41 = 0;
  if (CVar2 != CPPTYPE_STRING) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,"cpp_type() == FieldDescriptor::CPPTYPE_STRING");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
               ,0xf79,local_40._M_len,local_40._M_str);
    local_41 = 1;
    pLVar7 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar7);
  }
  if ((local_41 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
  }
  pFVar5 = features(this);
  pCVar6 = FeatureSet::
           GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                     (pFVar5,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                              *)pb::cpp);
  CVar3 = pb::CppFeatures::string_type(pCVar6);
  if (CVar3 == CppFeatures_StringType_VIEW) {
    this_local._4_4_ = kView;
  }
  else if (CVar3 == CppFeatures_StringType_CORD) {
    TVar4 = type(this);
    if (((TVar4 != TYPE_BYTES) || (bVar1 = is_repeated(this), bVar1)) ||
       (bVar1 = is_extension(this), bVar1)) {
      this_local._4_4_ = kString;
    }
    else {
      this_local._4_4_ = kCord;
    }
  }
  else if (CVar3 == CppFeatures_StringType_STRING) {
    this_local._4_4_ = kString;
  }
  else {
    pFVar5 = features(this);
    pCVar6 = FeatureSet::
             GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                       (pFVar5,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                                *)pb::cpp);
    bVar1 = pb::CppFeatures::has_string_type(pCVar6);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_78,"!features().GetExtension(pb::cpp).has_string_type()");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
                 ,0xf8a,local_78._M_len,local_78._M_str);
      pLVar7 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_68);
      absl::lts_20240722::log_internal::Voidify::operator&&(local_55,pLVar7);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_68);
    }
    this_local._4_4_ = kString;
  }
  return this_local._4_4_;
}

Assistant:

FieldDescriptor::CppStringType FieldDescriptor::cpp_string_type() const {
  ABSL_DCHECK(cpp_type() == FieldDescriptor::CPPTYPE_STRING);
  switch (features().GetExtension(pb::cpp).string_type()) {
    case pb::CppFeatures::VIEW:
      return CppStringType::kView;
    case pb::CppFeatures::CORD:
      // In open-source, protobuf CORD is only supported for singular bytes
      // fields.
      if (type() != FieldDescriptor::TYPE_BYTES || is_repeated() ||
          is_extension()) {
        return CppStringType::kString;
      }
      return CppStringType::kCord;
    case pb::CppFeatures::STRING:
      return CppStringType::kString;
    default:
      // If features haven't been resolved, this is a dynamic build not for C++
      // codegen.  Just use string type.
      ABSL_DCHECK(!features().GetExtension(pb::cpp).has_string_type());
      return CppStringType::kString;
  }
}